

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O0

int Gia_ManSeqMarkUsed_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vRoots)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *vRoots_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if ((*(ulong *)pObj >> 0x1e & 1) == 0) {
    p_local._4_4_ = 0;
  }
  else {
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
    iVar1 = Gia_ObjIsCo(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsRo(p,pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pObj);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScl.c"
                        ,0x8c,"int Gia_ManSeqMarkUsed_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        pGVar3 = Gia_ObjFanin0(pObj);
        iVar1 = Gia_ManSeqMarkUsed_rec(p,pGVar3,vRoots);
        pGVar3 = Gia_ObjFanin1(pObj);
        iVar2 = Gia_ManSeqMarkUsed_rec(p,pGVar3,vRoots);
        p_local._4_4_ = iVar1 + 1 + iVar2;
      }
      else {
        pGVar3 = Gia_ObjRoToRi(p,pObj);
        iVar1 = Gia_ObjId(p,pGVar3);
        Vec_IntPush(vRoots,iVar1);
        p_local._4_4_ = 0;
      }
    }
    else {
      pGVar3 = Gia_ObjFanin0(pObj);
      p_local._4_4_ = Gia_ManSeqMarkUsed_rec(p,pGVar3,vRoots);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManSeqMarkUsed_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vRoots )
{
    if ( !pObj->fMark0 )
        return 0;
    pObj->fMark0 = 0;
    if ( Gia_ObjIsCo(pObj) )
        return Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin0(pObj), vRoots );
    if ( Gia_ObjIsRo(p, pObj) )
    {
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
        return 0;
    }
    assert( Gia_ObjIsAnd(pObj) );
    return 1 + Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin0(pObj), vRoots )
             + Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin1(pObj), vRoots );
}